

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_0::PrecisionFormatCase::test(PrecisionFormatCase *this)

{
  CallLogWrapper *this_00;
  ostringstream *poVar1;
  int iVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  NotSupportedError *this_01;
  int iVar7;
  StateQueryMemoryWriteGuard<unsigned_char> shaderCompiler;
  StateQueryMemoryWriteGuard<int> precision;
  StateQueryMemoryWriteGuard<int[2]> range;
  StateQueryMemoryWriteGuard<unsigned_char> local_1db;
  StateQueryMemoryWriteGuard<int> local_1d8;
  StateQueryMemoryWriteGuard<int[2]> local_1c8;
  undefined1 local_1a8 [16];
  TestLog local_198 [13];
  ios_base local_130 [264];
  
  lVar6 = (long)(int)(this->m_precisionType - 0x8df0);
  uVar3 = *(undefined8 *)(&DAT_01c115c0 + lVar6 * 0xc);
  iVar2 = *(int *)(&DAT_01c115c8 + lVar6 * 0xc);
  local_1db.m_preguard = 0xde;
  local_1db.m_value = 0xde;
  local_1db.m_postguard = 0xde;
  local_1c8.m_postguard[0] = -0x21212122;
  local_1c8.m_postguard[1] = -0x21212122;
  local_1c8.m_preguard[0] = -0x21212122;
  local_1c8.m_preguard[1] = -0x21212122;
  local_1c8.m_value[0] = -0x21212122;
  local_1c8.m_value[1] = -0x21212122;
  local_1d8.m_preguard = -0x21212122;
  local_1d8.m_value = -0x21212122;
  local_1d8.m_postguard = -0x21212122;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGetBooleanv(this_00,0x8dfa,&local_1db.m_value);
  ApiCase::expectError(&this->super_ApiCase,0);
  bVar5 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::verifyValidity
                    (&local_1db,
                     (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  if (bVar5) {
    if (local_1db.m_value != '\x01') {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1a8._0_8_ = local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"SHADER_COMPILER = TRUE required","");
      tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_1a8);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    glu::CallLogWrapper::glGetShaderPrecisionFormat
              (this_00,this->m_shaderType,this->m_precisionType,local_1c8.m_value,&local_1d8.m_value
              );
    ApiCase::expectError(&this->super_ApiCase,0);
    bVar5 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[2]>::verifyValidity
                      (&local_1c8,
                       (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
    ;
    if ((bVar5) &&
       (bVar5 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                          (&local_1d8,
                           (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                           m_testCtx), bVar5)) {
      local_1a8._0_8_ = (this->super_ApiCase).m_log;
      poVar1 = (ostringstream *)(local_1a8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"range[0] = ",0xb);
      std::ostream::operator<<(poVar1,local_1c8.m_value[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"range[1] = ",0xb);
      std::ostream::operator<<(poVar1,local_1c8.m_value[1]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"precision = ",0xc);
      std::ostream::operator<<(poVar1,local_1d8.m_value);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_130);
      if (((this->m_shaderType != 0x8b30) ||
          (((this->m_precisionType != 0x8df5 && (this->m_precisionType != 0x8df2)) ||
           (local_1c8.m_value[0] != 0)))) ||
         ((local_1c8.m_value[1] != 0 || (local_1d8.m_value != 0)))) {
        iVar7 = (int)uVar3;
        bVar5 = iVar7 <= local_1c8.m_value[0];
        if (local_1c8.m_value[0] < iVar7) {
          local_1a8._0_8_ = (this->super_ApiCase).m_log;
          poVar1 = (ostringstream *)(local_1a8 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"// ERROR: Invalid range[0], expected greater or equal to ",
                     0x39);
          std::ostream::operator<<(poVar1,iVar7);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_130);
        }
        iVar7 = (int)((ulong)uVar3 >> 0x20);
        bVar4 = iVar7 <= local_1c8.m_value[1];
        if (!bVar4) {
          local_1a8._0_8_ = (this->super_ApiCase).m_log;
          poVar1 = (ostringstream *)(local_1a8 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"// ERROR: Invalid range[1], expected greater or equal to ",
                     0x39);
          std::ostream::operator<<(poVar1,iVar7);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_130);
        }
        if (local_1d8.m_value < iVar2) {
          local_1a8._0_8_ = (this->super_ApiCase).m_log;
          poVar1 = (ostringstream *)(local_1a8 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"// ERROR: Invalid precision, expected greater or equal to ",
                     0x3a);
          std::ostream::operator<<(poVar1,iVar2);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_130);
        }
        else if (bVar4 && bVar5) {
          return;
        }
        tcu::TestContext::setTestResult
                  ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Got invalid precision/range");
      }
    }
  }
  return;
}

Assistant:

void test (void)
	{
		const RequiredFormat											expected = getRequiredFormat();
		bool															error = false;
		gls::StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLboolean>	shaderCompiler;
		gls::StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLint[2]>	range;
		gls::StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLint>		precision;

		// requires SHADER_COMPILER = true
		glGetBooleanv(GL_SHADER_COMPILER, &shaderCompiler);
		expectError(GL_NO_ERROR);

		if (!shaderCompiler.verifyValidity(m_testCtx))
			return;
		if (shaderCompiler != GL_TRUE)
			throw tcu::NotSupportedError("SHADER_COMPILER = TRUE required");

		// query values
		glGetShaderPrecisionFormat(m_shaderType, m_precisionType, range, &precision);
		expectError(GL_NO_ERROR);

		if (!range.verifyValidity(m_testCtx))
			return;
		if (!precision.verifyValidity(m_testCtx))
			return;

		m_log
			<< tcu::TestLog::Message
			<< "range[0] = " << range[0] << "\n"
			<< "range[1] = " << range[1] << "\n"
			<< "precision = " << precision
			<< tcu::TestLog::EndMessage;

		// special case for highp and fragment shader

		if (m_shaderType == GL_FRAGMENT_SHADER && (m_precisionType == GL_HIGH_FLOAT || m_precisionType == GL_HIGH_INT))
		{
			// not supported is a valid return value
			if (range[0] == 0 && range[1] == 0 && precision == 0)
				return;
		}

		// verify the returned values

		if (range[0] < expected.negativeRange)
		{
			m_log << tcu::TestLog::Message << "// ERROR: Invalid range[0], expected greater or equal to " << expected.negativeRange << tcu::TestLog::EndMessage;
			error = true;
		}

		if (range[1] < expected.positiveRange)
		{
			m_log << tcu::TestLog::Message << "// ERROR: Invalid range[1], expected greater or equal to " << expected.positiveRange << tcu::TestLog::EndMessage;
			error = true;
		}

		if (precision < expected.precision)
		{
			m_log << tcu::TestLog::Message << "// ERROR: Invalid precision, expected greater or equal to " << expected.precision << tcu::TestLog::EndMessage;
			error = true;
		}

		if (error)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid precision/range");
	}